

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

void aom_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 local_5c;
  int local_58 [4];
  int16_t *local_48;
  int16_t *local_40;
  int16_t *local_38;
  
  bVar3 = (byte)log_scale;
  iVar9 = (1 << (bVar3 & 0x1f)) >> 1;
  local_58[0] = *zbin_ptr + iVar9 >> (bVar3 & 0x1f);
  local_58[2] = -local_58[0];
  local_58[1] = zbin_ptr[1] + iVar9 >> (bVar3 & 0x1f);
  local_58[3] = -local_58[1];
  local_48 = round_ptr;
  local_40 = quant_ptr;
  local_38 = quant_shift_ptr;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  uVar2 = n_coeffs & 0xffffffff;
  do {
    uVar12 = (uint)n_coeffs;
    if ((int)uVar2 < 1) break;
    sVar1 = scan[uVar2 - 1];
    if (qm_ptr == (qm_val_t *)0x0) {
      uVar10 = 0x20;
    }
    else {
      uVar10 = (uint)qm_ptr[sVar1];
    }
    iVar6 = uVar10 * coeff_ptr[sVar1];
    if (iVar6 < local_58[sVar1 != 0] * 0x20) {
      bVar14 = iVar6 + local_58[(ulong)(sVar1 != 0) + 2] * -0x20 != 0 &&
               local_58[(ulong)(sVar1 != 0) + 2] * 0x20 <= iVar6;
      n_coeffs = (intptr_t)(uVar12 - bVar14);
    }
    else {
      bVar14 = false;
    }
    uVar12 = (uint)n_coeffs;
    uVar2 = uVar2 - 1;
  } while (bVar14);
  if ((int)uVar12 < 1) {
    uVar5 = 0;
  }
  else {
    local_5c = 0xffffffff;
    uVar2 = 0;
    do {
      sVar1 = scan[uVar2];
      iVar6 = coeff_ptr[sVar1];
      iVar8 = -iVar6;
      if (0 < iVar6) {
        iVar8 = iVar6;
      }
      if (qm_ptr == (qm_val_t *)0x0) {
        bVar4 = 0x20;
      }
      else {
        bVar4 = qm_ptr[sVar1];
      }
      bVar14 = sVar1 != 0;
      if (local_58[bVar14] * 0x20 <= (int)(iVar8 * (uint)bVar4)) {
        uVar13 = (ulong)((uint)bVar14 * 2);
        iVar8 = (*(short *)((long)local_48 + uVar13) + iVar9 >> (bVar3 & 0x1f)) + iVar8;
        if (0x7ffe < iVar8) {
          iVar8 = 0x7fff;
        }
        if (iVar8 < -0x7fff) {
          iVar8 = -0x8000;
        }
        uVar10 = iVar6 >> 0x1f;
        uVar11 = (uint)((long)((long)*(short *)((long)local_38 + uVar13) *
                              (((long)((long)*(short *)((long)local_40 + uVar13) *
                                      (ulong)bVar4 * (long)iVar8) >> 0x10) +
                              (ulong)bVar4 * (long)iVar8)) >> (0x15 - bVar3 & 0x3f));
        qcoeff_ptr[sVar1] = (uVar10 ^ uVar11) - uVar10;
        if (iqm_ptr == (qm_val_t *)0x0) {
          uVar7 = 0x20;
        }
        else {
          uVar7 = (uint)iqm_ptr[sVar1];
        }
        dqcoeff_ptr[sVar1] =
             ((int)(((int)((int)dequant_ptr[bVar14] * uVar7 + 0x10) >> 5) * uVar11) >>
              (bVar3 & 0x1f) ^ uVar10) - uVar10;
        if (uVar11 != 0) {
          local_5c = (undefined4)uVar2;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar12 != uVar2);
    uVar5 = (short)local_5c + 1;
  }
  *eob_ptr = uVar5;
  return;
}

Assistant:

void aom_quantize_b_helper_c(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                             const int16_t *zbin_ptr, const int16_t *round_ptr,
                             const int16_t *quant_ptr,
                             const int16_t *quant_shift_ptr,
                             tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                             const int16_t *dequant_ptr, uint16_t *eob_ptr,
                             const int16_t *scan, const int16_t *iscan,
                             const qm_val_t *qm_ptr, const qm_val_t *iqm_ptr,
                             const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS)) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) eob = i;
    }
  }
  *eob_ptr = eob + 1;
}